

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void int_list_intersect(int *a,int *b,int *c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  
code_r0x00147edb:
  iVar3 = *b;
  while (-1 < iVar3) {
    while( true ) {
      iVar1 = *c;
      iVar2 = iVar1;
      while( true ) {
        if (iVar2 < 0) goto LAB_00147f1b;
        piVar4 = b + 1;
        if (iVar3 == iVar1) {
          *a = iVar1;
          a = a + 1;
          c = c + 1;
          b = piVar4;
          goto code_r0x00147edb;
        }
        if (iVar1 <= iVar3) break;
        iVar3 = *piVar4;
        b = piVar4;
        iVar2 = iVar3;
      }
      if (iVar3 <= iVar1) break;
      c = c + 1;
    }
  }
LAB_00147f1b:
  *a = -1;
  return;
}

Assistant:

void int_list_intersect(int *a, int *b, int *c) {
  while (1) {
    if (*b < 0) break;
  Lagainc:
    if (*c < 0) break;
  Lagainb:
    if (*b == *c) {
      *a++ = *b++;
      c++;
      continue;
    }
    if (*b < *c) {
      b++;
      if (*b < 0) break;
      goto Lagainb;
    }
    if (*c < *b) {
      c++;
      goto Lagainc;
    }
  }
  *a++ = -1;
}